

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O1

void vm_free(Vm *vm)

{
  Object *object;
  
  call_frame_free(*(vm->frames).frame_pointers);
  reallocate((vm->frames).frame_pointers,0);
  (vm->frames).count = 0;
  (vm->frames).cap = 0;
  (vm->frames).frame_pointers = (CallFrame **)0x0;
  while (object = vm->first_object, object != (Object *)0x0) {
    vm->first_object = object->next;
    free_object(object);
  }
  vm->sp = (CrispyValue *)0x0;
  vm->allocated_mem = 0;
  vm->max_alloc_mem = 0;
  vm->first_object = (Object *)0x0;
  ht_free(&vm->strings);
  return;
}

Assistant:

void vm_free(Vm *vm) {
    frames_free(&vm->frames);

    Object **obj = &vm->first_object;

    while (*obj) {
        Object *to_del = *obj;
        *obj = to_del->next;
        free_object(to_del);
    }

    vm->sp = NULL;
    vm->first_object = NULL;
    vm->allocated_mem = 0;
    vm->max_alloc_mem = 0;

    ht_free(&vm->strings);
}